

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variables_map.cpp
# Opt level: O2

variable_value * __thiscall
program_options::abstract_variables_map::operator[](abstract_variables_map *this,string *name)

{
  int iVar1;
  undefined4 extraout_var;
  variable_value *pvVar3;
  abstract_variables_map *paVar4;
  variable_value *pvVar2;
  
  do {
    paVar4 = this;
    iVar1 = (*paVar4->_vptr_abstract_variables_map[2])(paVar4,name);
    pvVar2 = (variable_value *)CONCAT44(extraout_var,iVar1);
    if ((pvVar2->v)._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) break;
    this = paVar4->m_next;
  } while (paVar4->m_next != (abstract_variables_map *)0x0);
  if ((((pvVar2->m_defaulted == true) && (paVar4->m_next != (abstract_variables_map *)0x0)) &&
      (pvVar3 = operator[](paVar4->m_next,name),
      (pvVar3->v)._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0)) &&
     (pvVar3->m_defaulted != true)) {
    return pvVar3;
  }
  return pvVar2;
}

Assistant:

const variable_value&
abstract_variables_map::operator[](const std::string& name) const
{
    const variable_value& v = get(name);
    if (v.empty() && m_next)
        return (*m_next)[name];
    else if (v.defaulted() && m_next) {
        const variable_value& v2 = (*m_next)[name];
        if (!v2.empty() && !v2.defaulted())
            return v2;
        else return v;
    } else {
        return v;
    }
}